

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::nonbasicValue(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  uint uVar1;
  Status SVar2;
  int32_t iVar3;
  pointer pnVar4;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  pointer pnVar9;
  ulong uVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  undefined4 *puVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  byte bVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar16 = 0;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  if (this->m_nonbasicValueUpToDate == true) {
    pnVar12 = &this->m_nonbasicValue;
    puVar14 = (uint *)__return_storage_ptr__;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar14 = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((pnVar12->m_backend).data._M_elems + 1);
      puVar14 = puVar14 + 1;
    }
    (__return_storage_ptr__->m_backend).exp = (this->m_nonbasicValue).m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = (this->m_nonbasicValue).m_backend.neg;
    iVar3 = (this->m_nonbasicValue).m_backend.prec_elem;
    (__return_storage_ptr__->m_backend).fpclass = (this->m_nonbasicValue).m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = iVar3;
  }
  else {
    local_c0 = __return_storage_ptr__;
    if (this->theRep == COLUMN) {
      uVar1 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      uVar11 = (ulong)uVar1;
      if (this->theType == LEAVE) {
        if (0 < (int)uVar1) {
          uVar10 = uVar11 + 1;
          lVar6 = uVar11 << 7;
          do {
            uVar11 = uVar11 - 1;
            SVar2 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data[uVar10 - 2];
            if (SVar2 == P_FIXED) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_0051269e:
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_005126a5:
              pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar6);
              local_148.fpclass = cpp_dec_float_finite;
              local_148.prec_elem = 0x1c;
              local_148.data._M_elems[0] = 0;
              local_148.data._M_elems[1] = 0;
              local_148.data._M_elems[2] = 0;
              local_148.data._M_elems[3] = 0;
              local_148.data._M_elems[4] = 0;
              local_148.data._M_elems[5] = 0;
              local_148.data._M_elems[6] = 0;
              local_148.data._M_elems[7] = 0;
              local_148.data._M_elems[8] = 0;
              local_148.data._M_elems[9] = 0;
              local_148.data._M_elems[10] = 0;
              local_148.data._M_elems[0xb] = 0;
              local_148.data._M_elems[0xc] = 0;
              local_148.data._M_elems[0xd] = 0;
              local_148.data._M_elems[0xe] = 0;
              local_148.data._M_elems[0xf] = 0;
              local_148.data._M_elems[0x10] = 0;
              local_148.data._M_elems[0x11] = 0;
              local_148.data._M_elems[0x12] = 0;
              local_148.data._M_elems[0x13] = 0;
              local_148.data._M_elems[0x14] = 0;
              local_148.data._M_elems[0x15] = 0;
              local_148.data._M_elems[0x16] = 0;
              local_148.data._M_elems[0x17] = 0;
              local_148.data._M_elems[0x18] = 0;
              local_148.data._M_elems[0x19] = 0;
              local_148.data._M_elems._104_5_ = 0;
              local_148.data._M_elems[0x1b]._1_3_ = 0;
              local_148.exp = 0;
              local_148.neg = false;
              if (pcVar5 == &local_148) {
                pcVar5 = &pnVar9[uVar11].m_backend;
              }
              else {
                puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar6);
                if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                  pcVar15 = &local_148;
                  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                    *(undefined4 *)pcVar15 = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                  }
                  local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar6 + 0x70);
                  local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar6 + 0x74);
                  local_148._120_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar6 + 0x78);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_148,pcVar5);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&local_b8,&local_148);
            }
            else {
              if (SVar2 == P_ON_LOWER) {
                pnVar9 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_0051269e;
              }
              if (SVar2 == P_ON_UPPER) {
                pnVar9 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pnVar4 = (this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_005126a5;
              }
            }
            uVar10 = uVar10 - 1;
            lVar6 = lVar6 + -0x80;
          } while (1 < uVar10);
        }
        lVar6 = (long)(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
        if (0 < lVar6) {
          uVar11 = lVar6 + 1;
          lVar7 = lVar6 << 7;
          do {
            lVar6 = lVar6 + -1;
            SVar2 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data[uVar11 - 2];
            if (SVar2 == P_FIXED) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_005127b8:
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_005127bc:
              pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar7);
              local_148.fpclass = cpp_dec_float_finite;
              local_148.prec_elem = 0x1c;
              local_148.data._M_elems[0] = 0;
              local_148.data._M_elems[1] = 0;
              local_148.data._M_elems[2] = 0;
              local_148.data._M_elems[3] = 0;
              local_148.data._M_elems[4] = 0;
              local_148.data._M_elems[5] = 0;
              local_148.data._M_elems[6] = 0;
              local_148.data._M_elems[7] = 0;
              local_148.data._M_elems[8] = 0;
              local_148.data._M_elems[9] = 0;
              local_148.data._M_elems[10] = 0;
              local_148.data._M_elems[0xb] = 0;
              local_148.data._M_elems[0xc] = 0;
              local_148.data._M_elems[0xd] = 0;
              local_148.data._M_elems[0xe] = 0;
              local_148.data._M_elems[0xf] = 0;
              local_148.data._M_elems[0x10] = 0;
              local_148.data._M_elems[0x11] = 0;
              local_148.data._M_elems[0x12] = 0;
              local_148.data._M_elems[0x13] = 0;
              local_148.data._M_elems[0x14] = 0;
              local_148.data._M_elems[0x15] = 0;
              local_148.data._M_elems[0x16] = 0;
              local_148.data._M_elems[0x17] = 0;
              local_148.data._M_elems[0x18] = 0;
              local_148.data._M_elems[0x19] = 0;
              local_148.data._M_elems._104_5_ = 0;
              local_148.data._M_elems[0x1b]._1_3_ = 0;
              local_148.exp = 0;
              local_148.neg = false;
              if (pcVar5 == &local_148) {
                pcVar5 = &pnVar9[lVar6].m_backend;
              }
              else {
                puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar7);
                if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                  pcVar15 = &local_148;
                  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                    *(undefined4 *)pcVar15 = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                  }
                  local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x70);
                  local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x74);
                  local_148._120_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x78);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_148,pcVar5);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&local_b8,&local_148);
            }
            else {
              if (SVar2 == P_ON_LOWER) {
                pnVar9 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_005127b8;
              }
              if (SVar2 == P_ON_UPPER) {
                pnVar9 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pnVar4 = (this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_005127bc;
              }
            }
            uVar11 = uVar11 - 1;
            lVar7 = lVar7 + -0x80;
          } while (1 < uVar11);
        }
      }
      else {
        if (0 < (int)uVar1) {
          uVar10 = uVar11 + 1;
          lVar6 = uVar11 << 7;
          do {
            uVar11 = uVar11 - 1;
            SVar2 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data[uVar10 - 2];
            if ((SVar2 == P_FIXED) || (SVar2 == P_ON_LOWER)) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_00512d8c:
              pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar6);
              local_148.fpclass = cpp_dec_float_finite;
              local_148.prec_elem = 0x1c;
              local_148.data._M_elems[0] = 0;
              local_148.data._M_elems[1] = 0;
              local_148.data._M_elems[2] = 0;
              local_148.data._M_elems[3] = 0;
              local_148.data._M_elems[4] = 0;
              local_148.data._M_elems[5] = 0;
              local_148.data._M_elems[6] = 0;
              local_148.data._M_elems[7] = 0;
              local_148.data._M_elems[8] = 0;
              local_148.data._M_elems[9] = 0;
              local_148.data._M_elems[10] = 0;
              local_148.data._M_elems[0xb] = 0;
              local_148.data._M_elems[0xc] = 0;
              local_148.data._M_elems[0xd] = 0;
              local_148.data._M_elems[0xe] = 0;
              local_148.data._M_elems[0xf] = 0;
              local_148.data._M_elems[0x10] = 0;
              local_148.data._M_elems[0x11] = 0;
              local_148.data._M_elems[0x12] = 0;
              local_148.data._M_elems[0x13] = 0;
              local_148.data._M_elems[0x14] = 0;
              local_148.data._M_elems[0x15] = 0;
              local_148.data._M_elems[0x16] = 0;
              local_148.data._M_elems[0x17] = 0;
              local_148.data._M_elems[0x18] = 0;
              local_148.data._M_elems[0x19] = 0;
              local_148.data._M_elems._104_5_ = 0;
              local_148.data._M_elems[0x1b]._1_3_ = 0;
              local_148.exp = 0;
              local_148.neg = false;
              if (pcVar5 == &local_148) {
                pcVar5 = &pnVar9[uVar11].m_backend;
              }
              else {
                puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar6);
                if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                  pcVar15 = &local_148;
                  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                    *(undefined4 *)pcVar15 = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                  }
                  local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar6 + 0x70);
                  local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar6 + 0x74);
                  local_148._120_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar6 + 0x78);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_148,pcVar5);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&local_b8,&local_148);
            }
            else if (SVar2 == P_ON_UPPER) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00512d8c;
            }
            uVar10 = uVar10 - 1;
            lVar6 = lVar6 + -0x80;
          } while (1 < uVar10);
        }
        lVar6 = (long)(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
        if (0 < lVar6) {
          uVar11 = lVar6 + 1;
          lVar7 = lVar6 << 7;
          do {
            lVar6 = lVar6 + -1;
            SVar2 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data[uVar11 - 2];
            if ((SVar2 == P_FIXED) || (SVar2 == P_ON_LOWER)) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_00512e9d:
              pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar7);
              local_148.fpclass = cpp_dec_float_finite;
              local_148.prec_elem = 0x1c;
              local_148.data._M_elems[0] = 0;
              local_148.data._M_elems[1] = 0;
              local_148.data._M_elems[2] = 0;
              local_148.data._M_elems[3] = 0;
              local_148.data._M_elems[4] = 0;
              local_148.data._M_elems[5] = 0;
              local_148.data._M_elems[6] = 0;
              local_148.data._M_elems[7] = 0;
              local_148.data._M_elems[8] = 0;
              local_148.data._M_elems[9] = 0;
              local_148.data._M_elems[10] = 0;
              local_148.data._M_elems[0xb] = 0;
              local_148.data._M_elems[0xc] = 0;
              local_148.data._M_elems[0xd] = 0;
              local_148.data._M_elems[0xe] = 0;
              local_148.data._M_elems[0xf] = 0;
              local_148.data._M_elems[0x10] = 0;
              local_148.data._M_elems[0x11] = 0;
              local_148.data._M_elems[0x12] = 0;
              local_148.data._M_elems[0x13] = 0;
              local_148.data._M_elems[0x14] = 0;
              local_148.data._M_elems[0x15] = 0;
              local_148.data._M_elems[0x16] = 0;
              local_148.data._M_elems[0x17] = 0;
              local_148.data._M_elems[0x18] = 0;
              local_148.data._M_elems[0x19] = 0;
              local_148.data._M_elems._104_5_ = 0;
              local_148.data._M_elems[0x1b]._1_3_ = 0;
              local_148.exp = 0;
              local_148.neg = false;
              if (pcVar5 == &local_148) {
                pcVar5 = &pnVar9[lVar6].m_backend;
              }
              else {
                puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar7);
                if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                  pcVar15 = &local_148;
                  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                    *(undefined4 *)pcVar15 = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                  }
                  local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x70);
                  local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x74);
                  local_148._120_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x78);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_148,pcVar5);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&local_b8,&local_148);
            }
            else if (SVar2 == P_ON_UPPER) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00512e9d;
            }
            uVar11 = uVar11 - 1;
            lVar7 = lVar7 + -0x80;
          } while (1 < uVar11);
        }
      }
    }
    else {
      lVar6 = (long)(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
      if (0 < lVar6) {
        uVar11 = lVar6 + 1;
        lVar7 = lVar6 << 7;
        do {
          lVar6 = lVar6 + -1;
          SVar2 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar11 - 2];
          if (SVar2 == D_ON_BOTH) {
            pnVar9 = (this->theLCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar5 = (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar7);
            local_148.fpclass = cpp_dec_float_finite;
            local_148.prec_elem = 0x1c;
            local_148.data._M_elems[0] = 0;
            local_148.data._M_elems[1] = 0;
            local_148.data._M_elems[2] = 0;
            local_148.data._M_elems[3] = 0;
            local_148.data._M_elems[4] = 0;
            local_148.data._M_elems[5] = 0;
            local_148.data._M_elems[6] = 0;
            local_148.data._M_elems[7] = 0;
            local_148.data._M_elems[8] = 0;
            local_148.data._M_elems[9] = 0;
            local_148.data._M_elems[10] = 0;
            local_148.data._M_elems[0xb] = 0;
            local_148.data._M_elems[0xc] = 0;
            local_148.data._M_elems[0xd] = 0;
            local_148.data._M_elems[0xe] = 0;
            local_148.data._M_elems[0xf] = 0;
            local_148.data._M_elems[0x10] = 0;
            local_148.data._M_elems[0x11] = 0;
            local_148.data._M_elems[0x12] = 0;
            local_148.data._M_elems[0x13] = 0;
            local_148.data._M_elems[0x14] = 0;
            local_148.data._M_elems[0x15] = 0;
            local_148.data._M_elems[0x16] = 0;
            local_148.data._M_elems[0x17] = 0;
            local_148.data._M_elems[0x18] = 0;
            local_148.data._M_elems[0x19] = 0;
            local_148.data._M_elems._104_5_ = 0;
            local_148.data._M_elems[0x1b]._1_3_ = 0;
            local_148.exp = 0;
            local_148.neg = false;
            if (pcVar5 == &local_148) {
              pcVar5 = &pnVar9[lVar6].m_backend;
            }
            else {
              puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar7);
              if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                pcVar15 = &local_148;
                for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                  *(undefined4 *)pcVar15 = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                }
                local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x70);
                local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x74);
                local_148._120_8_ = *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x78)
                ;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_148,pcVar5);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&local_b8,&local_148);
            pnVar9 = (this->theUCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar5 = (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .low.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar7);
            local_148.fpclass = cpp_dec_float_finite;
            local_148.prec_elem = 0x1c;
            local_148.data._M_elems[0] = 0;
            local_148.data._M_elems[1] = 0;
            local_148.data._M_elems[2] = 0;
            local_148.data._M_elems[3] = 0;
            local_148.data._M_elems[4] = 0;
            local_148.data._M_elems[5] = 0;
            local_148.data._M_elems[6] = 0;
            local_148.data._M_elems[7] = 0;
            local_148.data._M_elems[8] = 0;
            local_148.data._M_elems[9] = 0;
            local_148.data._M_elems[10] = 0;
            local_148.data._M_elems[0xb] = 0;
            local_148.data._M_elems[0xc] = 0;
            local_148.data._M_elems[0xd] = 0;
            local_148.data._M_elems[0xe] = 0;
            local_148.data._M_elems[0xf] = 0;
            local_148.data._M_elems[0x10] = 0;
            local_148.data._M_elems[0x11] = 0;
            local_148.data._M_elems[0x12] = 0;
            local_148.data._M_elems[0x13] = 0;
            local_148.data._M_elems[0x14] = 0;
            local_148.data._M_elems[0x15] = 0;
            local_148.data._M_elems[0x16] = 0;
            local_148.data._M_elems[0x17] = 0;
            local_148.data._M_elems[0x18] = 0;
            local_148.data._M_elems[0x19] = 0;
            local_148.data._M_elems._104_5_ = 0;
            local_148.data._M_elems[0x1b]._1_3_ = 0;
            local_148.exp = 0;
            local_148.neg = false;
            if (pcVar5 == &local_148) {
              pcVar5 = &pnVar9[lVar6].m_backend;
            }
            else {
              puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar7);
              if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                pcVar15 = &local_148;
                for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                  *(undefined4 *)pcVar15 = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                }
                local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x70);
                local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x74);
                local_148._120_8_ = *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x78)
                ;
              }
            }
LAB_00512aa2:
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_148,pcVar5);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&local_b8,&local_148);
          }
          else {
            if (SVar2 == D_ON_LOWER) {
              pnVar9 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_005128d7:
              pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar7);
              local_148.fpclass = cpp_dec_float_finite;
              local_148.prec_elem = 0x1c;
              local_148.data._M_elems[0] = 0;
              local_148.data._M_elems[1] = 0;
              local_148.data._M_elems[2] = 0;
              local_148.data._M_elems[3] = 0;
              local_148.data._M_elems[4] = 0;
              local_148.data._M_elems[5] = 0;
              local_148.data._M_elems[6] = 0;
              local_148.data._M_elems[7] = 0;
              local_148.data._M_elems[8] = 0;
              local_148.data._M_elems[9] = 0;
              local_148.data._M_elems[10] = 0;
              local_148.data._M_elems[0xb] = 0;
              local_148.data._M_elems[0xc] = 0;
              local_148.data._M_elems[0xd] = 0;
              local_148.data._M_elems[0xe] = 0;
              local_148.data._M_elems[0xf] = 0;
              local_148.data._M_elems[0x10] = 0;
              local_148.data._M_elems[0x11] = 0;
              local_148.data._M_elems[0x12] = 0;
              local_148.data._M_elems[0x13] = 0;
              local_148.data._M_elems[0x14] = 0;
              local_148.data._M_elems[0x15] = 0;
              local_148.data._M_elems[0x16] = 0;
              local_148.data._M_elems[0x17] = 0;
              local_148.data._M_elems[0x18] = 0;
              local_148.data._M_elems[0x19] = 0;
              local_148.data._M_elems._104_5_ = 0;
              local_148.data._M_elems[0x1b]._1_3_ = 0;
              local_148.exp = 0;
              local_148.neg = false;
              if (pcVar5 == &local_148) {
                pcVar5 = &pnVar9[lVar6].m_backend;
              }
              else {
                puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar7);
                if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                  pcVar15 = &local_148;
                  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                    *(undefined4 *)pcVar15 = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                  }
                  local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x70);
                  local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x74);
                  local_148._120_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x78);
                }
              }
              goto LAB_00512aa2;
            }
            if (SVar2 == D_ON_UPPER) {
              pnVar9 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_005128d7;
            }
          }
          uVar11 = uVar11 - 1;
          lVar7 = lVar7 + -0x80;
        } while (1 < uVar11);
      }
      lVar6 = (long)(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
      if (0 < lVar6) {
        uVar11 = lVar6 + 1;
        lVar7 = lVar6 << 7;
        do {
          lVar6 = lVar6 + -1;
          SVar2 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar11 - 2];
          if (SVar2 == D_ON_BOTH) {
            pnVar9 = (this->theLRbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar5 = (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .right.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar7);
            local_148.fpclass = cpp_dec_float_finite;
            local_148.prec_elem = 0x1c;
            local_148.data._M_elems[0] = 0;
            local_148.data._M_elems[1] = 0;
            local_148.data._M_elems[2] = 0;
            local_148.data._M_elems[3] = 0;
            local_148.data._M_elems[4] = 0;
            local_148.data._M_elems[5] = 0;
            local_148.data._M_elems[6] = 0;
            local_148.data._M_elems[7] = 0;
            local_148.data._M_elems[8] = 0;
            local_148.data._M_elems[9] = 0;
            local_148.data._M_elems[10] = 0;
            local_148.data._M_elems[0xb] = 0;
            local_148.data._M_elems[0xc] = 0;
            local_148.data._M_elems[0xd] = 0;
            local_148.data._M_elems[0xe] = 0;
            local_148.data._M_elems[0xf] = 0;
            local_148.data._M_elems[0x10] = 0;
            local_148.data._M_elems[0x11] = 0;
            local_148.data._M_elems[0x12] = 0;
            local_148.data._M_elems[0x13] = 0;
            local_148.data._M_elems[0x14] = 0;
            local_148.data._M_elems[0x15] = 0;
            local_148.data._M_elems[0x16] = 0;
            local_148.data._M_elems[0x17] = 0;
            local_148.data._M_elems[0x18] = 0;
            local_148.data._M_elems[0x19] = 0;
            local_148.data._M_elems._104_5_ = 0;
            local_148.data._M_elems[0x1b]._1_3_ = 0;
            local_148.exp = 0;
            local_148.neg = false;
            if (pcVar5 == &local_148) {
              pcVar5 = &pnVar9[lVar6].m_backend;
            }
            else {
              puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar7);
              if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                pcVar15 = &local_148;
                for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                  *(undefined4 *)pcVar15 = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                }
                local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x70);
                local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x74);
                local_148._120_8_ = *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x78)
                ;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_148,pcVar5);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&local_b8,&local_148);
            pnVar9 = (this->theURbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar5 = (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .left.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar7);
            local_148.fpclass = cpp_dec_float_finite;
            local_148.prec_elem = 0x1c;
            local_148.data._M_elems[0] = 0;
            local_148.data._M_elems[1] = 0;
            local_148.data._M_elems[2] = 0;
            local_148.data._M_elems[3] = 0;
            local_148.data._M_elems[4] = 0;
            local_148.data._M_elems[5] = 0;
            local_148.data._M_elems[6] = 0;
            local_148.data._M_elems[7] = 0;
            local_148.data._M_elems[8] = 0;
            local_148.data._M_elems[9] = 0;
            local_148.data._M_elems[10] = 0;
            local_148.data._M_elems[0xb] = 0;
            local_148.data._M_elems[0xc] = 0;
            local_148.data._M_elems[0xd] = 0;
            local_148.data._M_elems[0xe] = 0;
            local_148.data._M_elems[0xf] = 0;
            local_148.data._M_elems[0x10] = 0;
            local_148.data._M_elems[0x11] = 0;
            local_148.data._M_elems[0x12] = 0;
            local_148.data._M_elems[0x13] = 0;
            local_148.data._M_elems[0x14] = 0;
            local_148.data._M_elems[0x15] = 0;
            local_148.data._M_elems[0x16] = 0;
            local_148.data._M_elems[0x17] = 0;
            local_148.data._M_elems[0x18] = 0;
            local_148.data._M_elems[0x19] = 0;
            local_148.data._M_elems._104_5_ = 0;
            local_148.data._M_elems[0x1b]._1_3_ = 0;
            local_148.exp = 0;
            local_148.neg = false;
            if (pcVar5 == &local_148) {
              pcVar5 = &pnVar9[lVar6].m_backend;
            }
            else {
              puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar7);
              if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                pcVar15 = &local_148;
                for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                  *(undefined4 *)pcVar15 = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                }
                local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x70);
                local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x74);
                local_148._120_8_ = *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x78)
                ;
              }
            }
LAB_00512cff:
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_148,pcVar5);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&local_b8,&local_148);
          }
          else {
            if (SVar2 == D_ON_LOWER) {
              pnVar9 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_00512b31:
              pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar7);
              local_148.fpclass = cpp_dec_float_finite;
              local_148.prec_elem = 0x1c;
              local_148.data._M_elems[0] = 0;
              local_148.data._M_elems[1] = 0;
              local_148.data._M_elems[2] = 0;
              local_148.data._M_elems[3] = 0;
              local_148.data._M_elems[4] = 0;
              local_148.data._M_elems[5] = 0;
              local_148.data._M_elems[6] = 0;
              local_148.data._M_elems[7] = 0;
              local_148.data._M_elems[8] = 0;
              local_148.data._M_elems[9] = 0;
              local_148.data._M_elems[10] = 0;
              local_148.data._M_elems[0xb] = 0;
              local_148.data._M_elems[0xc] = 0;
              local_148.data._M_elems[0xd] = 0;
              local_148.data._M_elems[0xe] = 0;
              local_148.data._M_elems[0xf] = 0;
              local_148.data._M_elems[0x10] = 0;
              local_148.data._M_elems[0x11] = 0;
              local_148.data._M_elems[0x12] = 0;
              local_148.data._M_elems[0x13] = 0;
              local_148.data._M_elems[0x14] = 0;
              local_148.data._M_elems[0x15] = 0;
              local_148.data._M_elems[0x16] = 0;
              local_148.data._M_elems[0x17] = 0;
              local_148.data._M_elems[0x18] = 0;
              local_148.data._M_elems[0x19] = 0;
              local_148.data._M_elems._104_5_ = 0;
              local_148.data._M_elems[0x1b]._1_3_ = 0;
              local_148.exp = 0;
              local_148.neg = false;
              if (pcVar5 == &local_148) {
                pcVar5 = &pnVar9[lVar6].m_backend;
              }
              else {
                puVar13 = (undefined4 *)((long)&pnVar9[-1].m_backend.data + lVar7);
                if ((cpp_dec_float<200U,_int,_void> *)puVar13 != &local_148) {
                  pcVar15 = &local_148;
                  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                    *(undefined4 *)pcVar15 = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
                  }
                  local_148.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x70);
                  local_148.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x74);
                  local_148._120_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar7 + 0x78);
                }
              }
              goto LAB_00512cff;
            }
            if (SVar2 == D_ON_UPPER) {
              pnVar9 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00512b31;
            }
          }
          uVar11 = uVar11 - 1;
          lVar7 = lVar7 + -0x80;
        } while (1 < uVar11);
      }
    }
    if (this->m_nonbasicValueUpToDate == false) {
      pcVar5 = &local_b8;
      pnVar12 = &this->m_nonbasicValue;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pcVar5->data)._M_elems[0];
        pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + (ulong)bVar16 * -8 + 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + (ulong)bVar16 * -8 + 4);
      }
      (this->m_nonbasicValue).m_backend.exp = local_b8.exp;
      (this->m_nonbasicValue).m_backend.neg = local_b8.neg;
      (this->m_nonbasicValue).m_backend.fpclass = local_b8.fpclass;
      (this->m_nonbasicValue).m_backend.prec_elem = local_b8.prec_elem;
      this->m_nonbasicValueUpToDate = true;
    }
    pcVar5 = &local_b8;
    pnVar12 = local_c0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pcVar5->data)._M_elems[0];
      pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + ((ulong)bVar16 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
    }
    (local_c0->m_backend).exp = local_b8.exp;
    (local_c0->m_backend).neg = local_b8.neg;
    (local_c0->m_backend).fpclass = local_b8.fpclass;
    (local_c0->m_backend).prec_elem = local_b8.prec_elem;
    __return_storage_ptr__ = local_c0;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }